

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicstransform.cpp
# Opt level: O2

void QGraphicsRotation::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QVector3D *axis;
  undefined8 *puVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      axisChanged((QGraphicsRotation *)_o);
      return;
    }
    if (_id == 1) {
      angleChanged((QGraphicsRotation *)_o);
      return;
    }
    if (_id == 0) {
      originChanged((QGraphicsRotation *)_o);
      return;
    }
    break;
  case ReadProperty:
    puVar1 = (undefined8 *)*_a;
    if (_id == 2) {
      uVar3 = *(undefined8 *)(*(long *)(_o + 8) + 0x98);
      uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0xa0);
    }
    else {
      if (_id == 1) {
        *puVar1 = *(undefined8 *)(*(long *)(_o + 8) + 0x90);
        return;
      }
      if (_id != 0) {
        return;
      }
      uVar3 = *(undefined8 *)(*(long *)(_o + 8) + 0x80);
      uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x88);
    }
    *puVar1 = uVar3;
    *(undefined4 *)(puVar1 + 1) = uVar4;
    break;
  case WriteProperty:
    axis = (QVector3D *)*_a;
    if (_id == 2) {
      setAxis((QGraphicsRotation *)_o,axis);
      return;
    }
    if (_id == 1) {
      setAngle((QGraphicsRotation *)_o,*(qreal *)axis->v);
      return;
    }
    if (_id == 0) {
      setOrigin((QGraphicsRotation *)_o,axis);
      return;
    }
    break;
  case IndexOfMethod:
    bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsRotation::*)()>
                      ((QtMocHelpers *)_a,(void **)originChanged,0,0);
    if ((!bVar2) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsRotation::*)()>
                          ((QtMocHelpers *)_a,(void **)angleChanged,0,1), !bVar2)) {
      QtMocHelpers::indexOfMethod<void(QGraphicsRotation::*)()>
                ((QtMocHelpers *)_a,(void **)axisChanged,0,2);
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsRotation::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsRotation *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->originChanged(); break;
        case 1: _t->angleChanged(); break;
        case 2: _t->axisChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsRotation::*)()>(_a, &QGraphicsRotation::originChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsRotation::*)()>(_a, &QGraphicsRotation::angleChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsRotation::*)()>(_a, &QGraphicsRotation::axisChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QVector3D*>(_v) = _t->origin(); break;
        case 1: *reinterpret_cast<qreal*>(_v) = _t->angle(); break;
        case 2: *reinterpret_cast<QVector3D*>(_v) = _t->axis(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrigin(*reinterpret_cast<QVector3D*>(_v)); break;
        case 1: _t->setAngle(*reinterpret_cast<qreal*>(_v)); break;
        case 2: _t->setAxis(*reinterpret_cast<QVector3D*>(_v)); break;
        default: break;
        }
    }
}